

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_string_vector.cc
# Opt level: O1

void __thiscall s2coding::StringVectorEncoder::Encode(StringVectorEncoder *this,Encoder *encoder)

{
  Encoder *this_00;
  iterator __position;
  uchar *__src;
  size_t __n;
  size_t sVar1;
  Encoder *in_RCX;
  Encoder *encoder_00;
  s2coding *psVar2;
  s2coding *this_01;
  long lVar3;
  Span<const_unsigned_long_long> v;
  size_t sStack_98;
  StringVectorEncoder SStack_90;
  Encoder *pEStack_58;
  size_t local_20;
  
  this_00 = &this->data_;
  local_20 = Encoder::length(this_00);
  __position._M_current =
       (this->offsets_).super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->offsets_).super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
    _M_realloc_insert<unsigned_long_long>(&this->offsets_,__position,&local_20);
  }
  else {
    *__position._M_current = local_20;
    (this->offsets_).super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  psVar2 = (s2coding *)
           (this->offsets_).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_01 = (s2coding *)
            ((this->offsets_).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_start + 1);
  if (this_01 <= psVar2) {
    v.ptr_ = (pointer)((long)psVar2 - (long)this_01 >> 3);
    v.len_ = (size_type)encoder;
    EncodeUintVector<unsigned_long_long>(this_01,v,in_RCX);
    sVar1 = Encoder::length(this_00);
    Encoder::Ensure(encoder,sVar1);
    __src = (this->data_).orig_;
    sVar1 = Encoder::length(this_00);
    memcpy(encoder->buf_,__src,sVar1);
    encoder->buf_ = encoder->buf_ + sVar1;
    return;
  }
  Encode();
  pEStack_58 = encoder;
  StringVectorEncoder(&SStack_90);
  if (psVar2 != (s2coding *)0x0) {
    lVar3 = 0;
    do {
      sStack_98 = Encoder::length(&SStack_90.data_);
      if (SStack_90.offsets_.
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          SStack_90.offsets_.
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
        _M_realloc_insert<unsigned_long_long>
                  (&SStack_90.offsets_,
                   (iterator)
                   SStack_90.offsets_.
                   super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&sStack_98);
      }
      else {
        *SStack_90.offsets_.
         super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
         super__Vector_impl_data._M_finish = sStack_98;
        SStack_90.offsets_.
        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             SStack_90.offsets_.
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      Encoder::Ensure(&SStack_90.data_,*(size_t *)(this_01 + lVar3 + 8));
      __n = *(size_t *)(this_01 + lVar3 + 8);
      memcpy(SStack_90.data_.buf_,*(void **)(this_01 + lVar3),__n);
      SStack_90.data_.buf_ = SStack_90.data_.buf_ + __n;
      lVar3 = lVar3 + 0x20;
    } while ((long)psVar2 << 5 != lVar3);
  }
  Encode(&SStack_90,encoder_00);
  Encoder::~Encoder(&SStack_90.data_);
  if (SStack_90.offsets_.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(SStack_90.offsets_.
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void StringVectorEncoder::Encode(Encoder* encoder) {
  offsets_.push_back(data_.length());
  // We don't encode the first element of "offsets_", which is always zero.
  EncodeUintVector<uint64>(
      MakeSpan(offsets_.data() + 1, offsets_.data() + offsets_.size()),
      encoder);
  encoder->Ensure(data_.length());
  encoder->putn(data_.base(), data_.length());
}